

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::
NinjaCommandTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  hash_code commandHash;
  FileInfo *pFVar4;
  code *pcVar5;
  uint n;
  _Any_data *p_Var6;
  uint uVar7;
  BuildContext *this_00;
  StringRef S;
  TaskInterface ti_local;
  type addExecuteJob;
  BuildValue result;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  S.Length = ti.ctx;
  ti_local.impl = ti.impl;
  ti_local.ctx = S.Length;
  if ((*(byte *)(*(long *)((long)this + 8) + 0xa8) & 1) == 0) {
    S.Data = *(char **)(*(long *)((long)this + 0x10) + 0x78);
    commandHash = llvm::hash_value(*(llvm **)(*(long *)((long)this + 0x10) + 0x70),S);
    this_00 = *(BuildContext **)((long)this + 8);
    if (*(Rule **)(*(long *)((long)this + 0x10) + 8) ==
        ((this_00->manifest)._M_t.
         super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
         ._M_t.
         super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
         .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->phonyRule) {
      computeCommandResult(llbuild::basic::CommandSignature__const
                (&result,this,(CommandSignature)commandHash.value);
      uVar7 = anon_unknown.dwarf_988a7::BuildValue::getNumOutputs(&result);
      uVar3 = 0;
      do {
        n = uVar3;
        if (uVar7 == n) break;
        pFVar4 = anon_unknown.dwarf_988a7::BuildValue::getNthOutputInfo(&result,n);
        bVar2 = llbuild::basic::FileInfo::isMissing(pFVar4);
        uVar3 = n + 1;
      } while (!bVar2);
      bVar2 = uVar7 != n;
      anon_unknown.dwarf_988a7::BuildValue::toValue((ValueType *)&addExecuteJob,&result);
LAB_0012612b:
      llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&addExecuteJob,bVar2);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addExecuteJob);
      goto LAB_0012613b;
    }
    if (*(char *)((long)this + 0x1a) == '\x01') {
      if (((*(byte *)(*(long *)((long)this + 0x10) + 0x110) & 4) != 0) ||
         ((*(char *)((long)this + 0x1b) == '\x01' &&
          (*(size_t *)((long)this + 0x20) == commandHash.value)))) {
        computeCommandResult(llbuild::basic::CommandSignature__const
                  (&result,this,(CommandSignature)commandHash.value);
        if (result.kind != SuccessfulCommand) {
          __assert_fail("result.isSuccessfulCommand()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                        ,0x44a,
                        "bool (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::canUpdateIfNewerWithResult(const BuildValue &)"
                       );
        }
        uVar3 = anon_unknown.dwarf_988a7::BuildValue::getNumOutputs(&result);
        for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
          pFVar4 = anon_unknown.dwarf_988a7::BuildValue::getNthOutputInfo(&result,uVar7);
          bVar2 = llbuild::basic::FileInfo::isMissing(pFVar4);
          if (bVar2) {
LAB_00126158:
            anon_unknown.dwarf_988a7::BuildValue::~BuildValue(&result);
            this_00 = *(BuildContext **)((long)this + 8);
            goto LAB_00126166;
          }
          if (*(char *)(*(long *)((long)this + 8) + 0x92) == '\x01') {
            bVar2 = llbuild::basic::FileTimestamp::operator<=
                              (&pFVar4->modTime,(FileTimestamp *)((long)this + 0x28));
          }
          else {
            bVar2 = llbuild::basic::FileTimestamp::operator<
                              (&pFVar4->modTime,(FileTimestamp *)((long)this + 0x28));
          }
          if (bVar2 != false) goto LAB_00126158;
        }
        LOCK();
        piVar1 = (int *)(*(long *)((long)this + 8) + 200);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        anon_unknown.dwarf_988a7::BuildValue::toValue((ValueType *)&addExecuteJob,&result);
        bVar2 = false;
        goto LAB_0012612b;
      }
      *(undefined1 *)((long)this + 0x1a) = 0;
    }
LAB_00126166:
    this_00->numBuiltCommands = this_00->numBuiltCommands + 1;
    if (this_00->simulate == true) {
      if (this_00->quiet == false) {
        writeDescription((anonymous_namespace)::BuildContext&,llbuild::ninja::Command__
                  (this_00,*(Command **)((long)this + 0x10));
      }
    }
    else {
      if (*(char *)((long)this + 0x18) != '\x01') {
        if (*(char *)((long)this + 0x19) != '\0') {
          __assert_fail("!hasMissingInput",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                        ,0x4ba,
                        "virtual void (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::inputsAvailable(core::TaskInterface)"
                       );
        }
        addExecuteJob.ti.impl = ti_local.impl;
        addExecuteJob.ti.ctx = ti_local.ctx;
        addExecuteJob.this = (NinjaCommandTask *)this;
        if (*(Pool **)(*(long *)((long)this + 0x10) + 0x68) ==
            ((this_00->manifest)._M_t.
             super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
             .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->consolePool) {
          local_50._8_8_ = 0;
          local_50._M_unused._M_object = operator_new(0x18);
          *(NinjaCommandTask **)local_50._M_unused._0_8_ = addExecuteJob.this;
          *(void **)((long)local_50._M_unused._0_8_ + 8) = addExecuteJob.ti.impl;
          *(void **)((long)local_50._M_unused._0_8_ + 0x10) = addExecuteJob.ti.ctx;
          local_38 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1256:36)>
                     ::_M_invoke;
          local_40 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1256:36)>
                     ::_M_manager;
          llbuild::basic::SerialQueue::async(&this_00->consoleQueue,(function<void_()> *)&local_50);
          if (local_40 == (code *)0x0) {
            return;
          }
          p_Var6 = &local_50;
          pcVar5 = local_40;
        }
        else {
          result.kind = ExistingInput;
          result.numOutputInfos = 0;
          result.valueData.asOutputInfo.device._0_4_ = 0;
          result.valueData.asOutputInfo.device._4_4_ = 0;
          result.valueData.asOutputInfo.mode._0_4_ = 0x127844;
          result.valueData.asOutputInfo.mode._4_4_ = 0;
          result.valueData.asOutputInfo.inode._0_4_ = 0x127846;
          result.valueData.asOutputInfo.inode._4_4_ = 0;
          std::
          remove_reference<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1212:28)_&>
          ::type::operator()(&addExecuteJob,(function<void_()> *)&result);
          if ((code *)CONCAT44(result.valueData.asOutputInfo.inode._4_4_,
                               result.valueData.asOutputInfo.inode._0_4_) == (code *)0x0) {
            return;
          }
          p_Var6 = (_Any_data *)&result;
          pcVar5 = (code *)CONCAT44(result.valueData.asOutputInfo.inode._4_4_,
                                    result.valueData.asOutputInfo.inode._0_4_);
        }
        (*pcVar5)(p_Var6,p_Var6,__destroy_functor);
        return;
      }
      if (*(char *)((long)this + 0x19) != '\0') {
        anon_unknown.dwarf_988a7::BuildContext::emitError
                  (this_00,"cannot build \'%s\' due to missing input",
                   *(undefined8 *)(**(long **)(*(long *)((long)this + 0x10) + 0x10) + 0x20));
        anon_unknown.dwarf_988a7::BuildContext::incrementFailedCommands
                  (*(BuildContext **)((long)this + 8));
      }
    }
  }
  result.kind = SkippedCommand;
  result.numOutputInfos = 0;
  result.valueData.asOutputInfo.device._0_4_ = 0;
  result.valueData.asOutputInfo.device._4_4_ = 0;
  result.valueData.asOutputInfo.inode._0_4_ = 0;
  result.valueData.asOutputInfo.inode._4_4_ = 0;
  result.valueData.asOutputInfo.mode._0_4_ = 0;
  result.valueData.asOutputInfo.mode._4_4_ = 0;
  result.valueData.asOutputInfo.size._0_4_ = 0;
  result.valueData._28_8_ = 0;
  result.valueData._36_8_ = 0;
  result.valueData._44_8_ = 0;
  result.valueData._52_8_ = 0;
  result.valueData._60_8_ = 0;
  result.valueData._68_4_ = 0;
  result.valueData._72_4_ = 0;
  result.valueData._76_4_ = 0;
  result.commandHash.value = 0;
  anon_unknown.dwarf_988a7::BuildValue::toValue((ValueType *)&addExecuteJob,&result);
  llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&addExecuteJob,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addExecuteJob);
LAB_0012613b:
  anon_unknown.dwarf_988a7::BuildValue::~BuildValue(&result);
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // If the build is cancelled, skip everything.
      if (context.isCancelled) {
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // Ignore phony commands.
      //
      // FIXME: Is it right to bring this up-to-date when one of the inputs
      // indicated a failure? It probably doesn't matter.
      auto commandHash = CommandSignature(command->getCommandString());
      if (command->getRule() == context.manifest->getPhonyRule()) {
        // Get the result.
        BuildValue result = computeCommandResult(commandHash);

        // If any output is missing, then we always want to force the change to
        // propagate.
        bool forceChange = false;
        for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
            if (result.getNthOutputInfo(i).isMissing()) {
                forceChange = true;
                break;
            }
        }

        return ti.complete(result.toValue(), forceChange);
      }

      // If it is legal to simply update the command, then if the command output
      // exists and is newer than all of the inputs, don't actually run the
      // command (just bring it up-to-date).
      if (canUpdateIfNewer) {
        // If this isn't a generator command and its command hash differs, we
        // can't update it.
        if (!command->hasGeneratorFlag() &&
            (!hasPriorResult || priorCommandHash != commandHash))
          canUpdateIfNewer = false;

        if (canUpdateIfNewer) {
          BuildValue result = computeCommandResult(commandHash);

          if (canUpdateIfNewerWithResult(result)) {
            // Update the count of the number of commands which have been
            // updated without being rerun.
            ++context.numCommandsUpdated;

            return ti.complete(result.toValue());
          }
        }
      }

      // Otherwise, actually run the command.

      ++context.numBuiltCommands;

      // If we are simulating the build, just print the description and
      // complete.
      if (context.simulate) {
        if (!context.quiet)
          writeDescription(context, command);
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // If not simulating, but this command should be skipped, then do nothing.
      if (shouldSkip) {
        // If this command had a failed input, treat it as having failed.
        if (hasMissingInput) {
          context.emitError("cannot build '%s' due to missing input",
                            command->getOutputs()[0]->getScreenPath().c_str());

          // Update the count of failed commands.
          context.incrementFailedCommands();
        }

        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }
      assert(!hasMissingInput);

      auto addExecuteJob = [this, ti](std::function<void(void)>&& jobFullyExecuted) mutable {
        // Otherwise, enqueue the job to run later.
        ti.spawn({command, [this, ti, done=std::move(jobFullyExecuted)] (QueueJobContext* qctx) mutable {
          // Suppress static analyzer false positive on generalized lambda capture
          // (rdar://problem/22165130).
#ifndef __clang_analyzer__
          // Take care to not rely on the ``this`` object, which may disappear
          // before the queue executes this block.
          BuildContext& localContext(context);
          ninja::Command* localCommand(command);
          auto bucket = qctx->laneID();

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t startTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"B\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(startTime));
              });
          }

          executeCommand(ti, qctx);

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t endTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"E\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(endTime));
              });
          }
          done();
#endif
        }});
      };

      bool isConsolePool = command->getExecutionPool() == context.manifest->getConsolePool();
      if (isConsolePool) {
        context.consoleQueue.async([addExecuteJob=std::move(addExecuteJob)] () mutable {
          std::promise<void> p;
          auto result = p.get_future();
          addExecuteJob([&p]{ p.set_value(); });
          result.get();
        });
      } else {
        addExecuteJob([]{});
      }
    }